

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

Path * __thiscall tinyusdz::Path::get_parent_prim_path(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  string *p;
  allocator local_d9;
  string local_d8;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  long local_48;
  size_t n;
  string local_38;
  Path *local_18;
  Path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  if ((this->_valid & 1U) == 0) {
    Path(__return_storage_ptr__);
  }
  else {
    bVar1 = is_root_prim(this);
    if (bVar1) {
      Path(__return_storage_ptr__,this);
    }
    else {
      bVar1 = is_prim_property_path(this);
      if (bVar1) {
        p = prim_part_abi_cxx11_(this);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_38,"",(allocator *)((long)&n + 7));
        Path(__return_storage_ptr__,p,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&n + 7));
      }
      else {
        local_48 = ::std::__cxx11::string::find_last_of((char)this,0x2f);
        if (local_48 == -1) {
          Path(__return_storage_ptr__);
        }
        else if (local_48 == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_68,"/",&local_69);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_90,"",&local_91);
          Path(__return_storage_ptr__,&local_68,&local_90);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
          ::std::__cxx11::string::~string((string *)&local_68);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)this);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
          Path(__return_storage_ptr__,&local_b8,&local_d8);
          ::std::__cxx11::string::~string((string *)&local_d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          ::std::__cxx11::string::~string((string *)&local_b8);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_parent_prim_path() const {
  if (!_valid) {
    return Path();
  }

  if (is_root_prim()) {
    return *this;
  }

  if (is_prim_property_path()) {
    // return prim part
    return Path(prim_part(), "");
  }

  size_t n = _prim_part.find_last_of('/');
  if (n == std::string::npos) {
    // this should never happen though.
    return Path();
  }

  if (n == 0) {
    // return root
    return Path("/", "");
  }

  return Path(_prim_part.substr(0, n), "");
}